

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineStatusOutput.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_9f230::CommandLineStatusOutputImpl::close
          (CommandLineStatusOutputImpl *this,int __fd)

{
  string *error_out_local;
  CommandLineStatusOutputImpl *this_local;
  
  if ((this->hasOutput & 1U) != 0) {
    fprintf((FILE *)this->fp,"\n");
    fflush((FILE *)this->fp);
  }
  this->fp = (FILE *)0x0;
  this->isClosed = true;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool close(std::string* error_out) {
    if (hasOutput) {
      fprintf(fp, "\n");
      fflush(fp);
    }

    fp = nullptr;
    isClosed = true; // Don't allow re-opening.
    return true;
  }